

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

void __thiscall
option::Stats::Stats
          (Stats *this,bool gnu,Descriptor *usage,int argc,char **argv,int min_abbr_len,
          bool single_minus_longopt)

{
  Descriptor *pDVar1;
  uint uVar2;
  Descriptor *pDVar3;
  Action local_20;
  Stats *local_18;
  
  this->buffer_max = 1;
  this->options_max = 1;
  if (usage->shortopt != (char *)0x0) {
    uVar2 = 1;
    pDVar3 = usage;
    do {
      if (uVar2 <= pDVar3->index + 1) {
        uVar2 = pDVar3->index + 2;
        this->options_max = uVar2;
      }
      pDVar1 = pDVar3 + 1;
      pDVar3 = pDVar3 + 1;
    } while (pDVar1->shortopt != (char *)0x0);
  }
  local_20._vptr_Action = (_func_int **)&PTR_perform_00125cf0;
  local_18 = this;
  Parser::workhorse(gnu,usage,argc,argv,&local_20,single_minus_longopt,false,min_abbr_len);
  return;
}

Assistant:

Stats(bool gnu, const Descriptor usage[], int argc, char** argv, int min_abbr_len = 0, //
        bool single_minus_longopt = false) :
      buffer_max(1), options_max(1) // 1 more than necessary as sentinel
  {
    add(gnu, usage, argc, (const char**) argv, min_abbr_len, single_minus_longopt);
  }